

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O0

int ddWindow3(DdManager *table,int low,int high)

{
  int iVar1;
  int local_24;
  int res;
  int x;
  int high_local;
  int low_local;
  DdManager *table_local;
  
  local_24 = low;
  if (high - low < 2) {
    table_local._4_4_ = ddWindow2(table,low,high);
  }
  else {
    for (; local_24 + 1 < high; local_24 = local_24 + 1) {
      iVar1 = ddPermuteWindow3(table,local_24);
      if (iVar1 == 0) {
        return 0;
      }
    }
    table_local._4_4_ = 1;
  }
  return table_local._4_4_;
}

Assistant:

static int
ddWindow3(
  DdManager * table,
  int  low,
  int  high)
{

    int x;
    int res;

#ifdef DD_DEBUG
    assert(low >= 0 && high < table->size);
#endif

    if (high-low < 2) return(ddWindow2(table,low,high));

    for (x = low; x+1 < high; x++) {
        res = ddPermuteWindow3(table,x);
        if (res == 0) return(0);
#ifdef DD_STATS
        if (res == ABC) {
            (void) fprintf(table->out,"=");
        } else {
            (void) fprintf(table->out,"-");
        }
        fflush(table->out);
#endif
    }

    return(1);

}